

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::EndColumns(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiOldColumns *pIVar3;
  ImGuiOldColumns *pIVar4;
  ImGuiOldColumnData *pIVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  ImGuiCol idx;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  ImU32 col;
  uint uVar12;
  int iVar13;
  int column_index;
  ulong uVar14;
  ImGuiOldColumnData *unaff_RBP;
  ImDrawList *in_RSI;
  ImGuiContext *g;
  long lVar15;
  ImGuiID id;
  ulong uVar16;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar17 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar28 [48];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  float fVar29;
  float fVar30;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_9a;
  bool local_99;
  uint local_98;
  float local_94;
  ulong local_90;
  float local_84;
  ImVec2 local_80;
  undefined1 local_78 [8];
  ImRect local_70;
  ImGuiContext *local_60;
  ImVector<ImDrawVert> local_58;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar18 [32];
  
  pIVar10 = GImGui;
  auVar28 = in_ZmmResult._16_48_;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    in_RSI = pIVar2->DrawList;
    ImDrawListSplitter::Merge(&pIVar3->Splitter,in_RSI);
  }
  local_98 = pIVar3->Flags;
  fVar30 = (pIVar2->DC).CursorPos.y;
  uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar30),ZEXT416((uint)pIVar3->LineMaxY),2);
  bVar11 = (bool)((byte)uVar6 & 1);
  auVar22._16_48_ = auVar28;
  auVar22._0_16_ = ZEXT416((uint)fVar30);
  auVar21._4_60_ = auVar22._4_60_;
  auVar21._0_4_ = (float)((uint)bVar11 * (int)pIVar3->LineMaxY + (uint)!bVar11 * (int)fVar30);
  pIVar3->LineMaxY = auVar21._0_4_;
  (pIVar2->DC).CursorPos.y = auVar21._0_4_;
  if ((local_98 & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if (((local_98 & 1) == 0) && (pIVar2->SkipItems == false)) {
    uVar12 = pIVar3->Count;
    column_index = -1;
    if (1 < (int)uVar12) {
      local_60 = pIVar10;
      fVar30 = (pIVar2->ClipRect).Min.y;
      uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar30),ZEXT416((uint)pIVar3->HostCursorPosY),2);
      bVar11 = (bool)((byte)uVar6 & 1);
      auVar23._16_48_ = auVar28;
      auVar23._0_16_ = ZEXT416((uint)fVar30);
      auVar24._4_60_ = auVar23._4_60_;
      auVar24._0_4_ =
           (float)((uint)bVar11 * (int)pIVar3->HostCursorPosY + (uint)!bVar11 * (int)fVar30);
      local_58 = auVar24._0_16_;
      auVar17 = vminss_avx(auVar21._0_16_,ZEXT416((uint)(pIVar2->ClipRect).Max.y));
      local_94 = auVar17._0_4_;
      local_84 = auVar24._0_4_ + 1.0;
      local_90 = 0xffffffff;
      uVar14 = 1;
      lVar15 = 0;
      do {
        pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
        if (pIVar4 == (ImGuiOldColumns *)0x0) {
          local_70.Max.x = 0.0;
        }
        else {
          auVar17 = vfmadd132ss_fma(ZEXT416((uint)(pIVar4->OffMaxX - pIVar4->OffMinX)),
                                    ZEXT416((uint)pIVar4->OffMinX),
                                    ZEXT416(*(uint *)((long)&(pIVar4->Columns).Data[1].OffsetNorm +
                                                     lVar15)));
          local_70.Max.x = auVar17._0_4_;
        }
        unaff_RBP = (pIVar3->Columns).Data;
        local_70.Max.x = local_70.Max.x + (pIVar2->Pos).x;
        uVar16 = pIVar3->ID + uVar14;
        local_70.Min.x = local_70.Max.x + -4.0;
        _local_48 = ZEXT416((uint)local_70.Max.x);
        local_70.Max.x = local_70.Max.x + 4.0;
        local_70.Min.y = (float)local_58.Size;
        local_70.Max.y = local_94;
        id = (ImGuiID)uVar16;
        KeepAliveID(id);
        in_RSI = (ImDrawList *)(uVar16 & 0xffffffff);
        bVar11 = IsClippedEx(&local_70,id);
        if (!bVar11) {
          local_99 = false;
          local_9a = false;
          if ((local_98 & 2) == 0) {
            ButtonBehavior(&local_70,id,&local_99,&local_9a,0);
            if ((local_99 != false) || (local_9a == true)) {
              local_60->MouseCursor = 4;
            }
            if (local_9a == true) {
              if ((*(byte *)((long)&unaff_RBP[1].Flags + lVar15) & 2) == 0) {
                local_90 = uVar14;
              }
              local_90 = local_90 & 0xffffffff;
            }
          }
          idx = (local_99 & 1) + 0x1b;
          if (local_9a != false) {
            idx = 0x1d;
          }
          col = GetColorU32(idx,1.0);
          auVar17._0_4_ = (int)(float)local_48._0_4_;
          auVar17._4_4_ = (int)(float)local_48._4_4_;
          auVar17._8_4_ = (int)fStack_40;
          auVar17._12_4_ = (int)fStack_3c;
          auVar17 = vcvtdq2ps_avx(auVar17);
          local_80.x = auVar17._0_4_;
          local_78._4_4_ = local_84;
          local_80.y = local_94;
          in_RSI = (ImDrawList *)local_78;
          local_78._0_4_ = local_80.x;
          ImDrawList::AddLine(pIVar2->DrawList,(ImVec2 *)in_RSI,&local_80,col,1.0);
        }
        auVar28 = auVar24._16_48_;
        uVar14 = uVar14 + 1;
        uVar12 = pIVar3->Count;
        lVar15 = lVar15 + 0x1c;
      } while ((long)uVar14 < (long)(int)uVar12);
      column_index = (int)local_90;
    }
    if (column_index != -1) {
      if ((-1 < (int)uVar12) && (pIVar3->IsBeingResized == false)) {
        pIVar5 = (pIVar3->Columns).Data;
        uVar14 = (ulong)((uVar12 & 0x7ffffff0) + 0x10);
        auVar21 = vpbroadcastq_avx512f();
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar24 = vpbroadcastq_avx512f(ZEXT816(0x1c));
        auVar25 = vpbroadcastq_avx512f(ZEXT816(0x10));
        do {
          uVar16 = vpcmpuq_avx512f(auVar23,auVar21,2);
          uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
          auVar26 = vpmullq_avx512dq(auVar23,auVar24);
          auVar27 = vpmullq_avx512dq(auVar22,auVar24);
          auVar18 = vgatherqps_avx512f(*(undefined8 *)
                                        ((long)&(in_RSI->CmdBuffer).Size + (long)&pIVar5->OffsetNorm
                                        ));
          auVar19._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar18._8_8_;
          auVar19._0_8_ = (ulong)((byte)uVar7 & 1) * auVar18._0_8_;
          auVar19._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar18._16_8_;
          auVar19._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar18._24_8_;
          auVar18 = vgatherqps_avx512f(*(undefined8 *)
                                        ((long)&unaff_RBP->OffsetNorm + (long)&pIVar5->OffsetNorm));
          auVar20._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar18._8_8_;
          auVar20._0_8_ = (ulong)((byte)uVar16 & 1) * auVar18._0_8_;
          auVar20._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar18._16_8_;
          auVar20._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar18._24_8_;
          vscatterqps_avx512f(ZEXT864(pIVar5) + ZEXT864(4) + auVar26,uVar16,auVar20);
          vscatterqps_avx512f(ZEXT864(pIVar5) + ZEXT864(4) + auVar27,uVar7,auVar19);
          auVar23 = vpaddq_avx512f(auVar23,auVar25);
          auVar22 = vpaddq_avx512f(auVar22,auVar25);
          auVar28 = auVar22._16_48_;
          uVar14 = uVar14 - 0x10;
        } while (uVar14 != 0);
      }
      pIVar3->IsBeingResized = true;
      fVar30 = (((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0) -
               (GImGui->CurrentWindow->Pos).x;
      pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar4 == (ImGuiOldColumns *)0x0) {
        fVar29 = 0.0;
      }
      else {
        if (column_index < 1) {
          iVar13 = pIVar4->Current;
        }
        else {
          iVar13 = column_index + -1;
        }
        auVar17 = vfmadd132ss_fma(ZEXT416((uint)(pIVar4->OffMaxX - pIVar4->OffMinX)),
                                  ZEXT416((uint)pIVar4->OffMinX),
                                  ZEXT416((uint)(pIVar4->Columns).Data[iVar13].OffsetNorm));
        fVar29 = auVar17._0_4_;
      }
      fVar1 = (GImGui->Style).ColumnsMinSpacing;
      fVar29 = fVar29 + fVar1;
      uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar29),ZEXT416((uint)fVar30),2);
      bVar11 = (bool)((byte)uVar6 & 1);
      auVar26._16_48_ = auVar28;
      auVar26._0_16_ = ZEXT416((uint)fVar29);
      auVar25._4_60_ = auVar26._4_60_;
      auVar25._0_4_ = (uint)bVar11 * (int)fVar30 + (uint)!bVar11 * (int)fVar29;
      auVar17 = auVar25._0_16_;
      if ((pIVar3->Flags & 4) != 0) {
        if (pIVar4 == (ImGuiOldColumns *)0x0) {
          fVar30 = 0.0;
        }
        else {
          if (column_index < -1) {
            iVar13 = pIVar4->Current;
          }
          else {
            iVar13 = column_index + 1;
          }
          auVar8 = vfmadd132ss_fma(ZEXT416((uint)(pIVar4->OffMaxX - pIVar4->OffMinX)),
                                   ZEXT416((uint)pIVar4->OffMinX),
                                   ZEXT416((uint)(pIVar4->Columns).Data[iVar13].OffsetNorm));
          fVar30 = auVar8._0_4_;
        }
        auVar17 = vminss_avx(auVar17,ZEXT416((uint)(fVar30 - fVar1)));
      }
      SetColumnOffset(column_index,auVar17._0_4_);
    }
    bVar11 = column_index != -1;
  }
  else {
    bVar11 = false;
  }
  pIVar3->IsBeingResized = bVar11;
  IVar9 = (pIVar2->ParentWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar2->ParentWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar9;
  IVar9 = (pIVar3->HostBackupParentWorkRect).Max;
  (pIVar2->ParentWorkRect).Min = (pIVar3->HostBackupParentWorkRect).Min;
  (pIVar2->ParentWorkRect).Max = IVar9;
  (pIVar2->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  auVar17 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0)));
  (pIVar2->DC).CursorPos.x = auVar17._0_4_;
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id)) // FIXME: Can be removed or replaced with a lower-level test
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}